

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_dispatch.cpp
# Opt level: O0

bool C_ExecFile(char *file)

{
  uint uVar1;
  FExecList *this;
  FExecList *exec;
  char *file_local;
  
  this = C_ParseExecFile(file,(FExecList *)0x0);
  if (this != (FExecList *)0x0) {
    FExecList::ExecCommands(this);
    uVar1 = TArray<FString,_FString>::Size(&this->Pullins);
    if (uVar1 != 0) {
      Printf("\x1c+Notice: Pullin files were ignored.\n");
    }
    if (this != (FExecList *)0x0) {
      FExecList::~FExecList(this);
      operator_delete(this,0x20);
    }
  }
  return this != (FExecList *)0x0;
}

Assistant:

bool C_ExecFile (const char *file)
{
	FExecList *exec = C_ParseExecFile(file, NULL);
	if (exec != NULL)
	{
		exec->ExecCommands();
		if (exec->Pullins.Size() > 0)
		{
			Printf(TEXTCOLOR_BOLD "Notice: Pullin files were ignored.\n");
		}
		delete exec;
	}
	return exec != NULL;
}